

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group_collection.cpp
# Opt level: O2

shared_ptr<duckdb::RowGroupCollection,_true> __thiscall
duckdb::RowGroupCollection::AddColumn
          (RowGroupCollection *this,ClientContext *context,ColumnDefinition *new_column,
          ExpressionExecutor *default_executor)

{
  idx_t i;
  RowGroupCollection *pRVar1;
  ColumnStatistics *this_00;
  ColumnDefinition *new_column_00;
  pointer this_01;
  BaseStatistics *other;
  RowGroupSegmentTree *this_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  TableStatistics *lock_00;
  Vector *in_R8;
  RowGroup *new_collection;
  shared_ptr<duckdb::RowGroupCollection,_true> sVar2;
  unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true> new_row_group;
  unique_ptr<duckdb::TableStatisticsLock,_std::default_delete<duckdb::TableStatisticsLock>,_true>
  lock;
  SegmentIterator __begin1;
  unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_> local_128;
  templated_unique_single_t new_stats;
  vector<duckdb::LogicalType,_true> new_types;
  LogicalType local_f8;
  SegmentIterationHelper local_e0;
  Vector default_vector;
  DataChunk dummy_chunk;
  
  i = ((long)(context->logger).
             super_unique_ptr<duckdb::Logger,_std::default_delete<duckdb::Logger>_>._M_t.
             super___uniq_ptr_impl<duckdb::Logger,_std::default_delete<duckdb::Logger>_>._M_t.
             super__Tuple_impl<0UL,_duckdb::Logger_*,_std::default_delete<duckdb::Logger>_>.
             super__Head_base<0UL,_duckdb::Logger_*,_false>._M_head_impl -
      (long)(context->registered_state).
            super_unique_ptr<duckdb::RegisteredStateManager,_std::default_delete<duckdb::RegisteredStateManager>_>
            ._M_t.
            super___uniq_ptr_impl<duckdb::RegisteredStateManager,_std::default_delete<duckdb::RegisteredStateManager>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::RegisteredStateManager_*,_std::default_delete<duckdb::RegisteredStateManager>_>
            .super__Head_base<0UL,_duckdb::RegisteredStateManager_*,_false>._M_head_impl) / 0x18;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&new_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
             (vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
             &context->registered_state);
  ColumnDefinition::GetType((LogicalType *)&default_vector,(ColumnDefinition *)default_executor);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::
  emplace_back<duckdb::LogicalType>
            (&new_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
             (LogicalType *)&default_vector);
  LogicalType::~LogicalType((LogicalType *)&default_vector);
  default_vector._0_8_ =
       (context->db).internal.
       super___shared_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  make_shared_ptr<duckdb::RowGroupCollection,duckdb::shared_ptr<duckdb::DataTableInfo,true>&,duckdb::BlockManager&,duckdb::vector<duckdb::LogicalType,true>,unsigned_long&,unsigned_long,unsigned_long_const&>
            ((shared_ptr<duckdb::DataTableInfo,_true> *)this,
             (BlockManager *)
             &(context->db).internal.
              super___shared_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (vector<duckdb::LogicalType,_true> *)
             (context->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
             super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             (unsigned_long *)&new_types,&(context->config).home_directory._M_string_length,
             (unsigned_long *)&default_vector);
  DataChunk::DataChunk(&dummy_chunk);
  ColumnDefinition::GetType(&local_f8,(ColumnDefinition *)default_executor);
  Vector::Vector(&default_vector,&local_f8,0x800);
  LogicalType::~LogicalType(&local_f8);
  pRVar1 = shared_ptr<duckdb::RowGroupCollection,_true>::operator->
                     ((shared_ptr<duckdb::RowGroupCollection,_true> *)this);
  ColumnDefinition::GetType((LogicalType *)&__begin1,(ColumnDefinition *)default_executor);
  TableStatistics::InitializeAddColumn
            (&pRVar1->stats,(TableStatistics *)&(context->config).enable_profiler,
             (LogicalType *)&__begin1);
  LogicalType::~LogicalType((LogicalType *)&__begin1);
  pRVar1 = shared_ptr<duckdb::RowGroupCollection,_true>::operator->
                     ((shared_ptr<duckdb::RowGroupCollection,_true> *)this);
  lock_00 = &pRVar1->stats;
  TableStatistics::GetLock((TableStatistics *)&lock);
  pRVar1 = shared_ptr<duckdb::RowGroupCollection,_true>::operator->
                     ((shared_ptr<duckdb::RowGroupCollection,_true> *)this);
  unique_ptr<duckdb::TableStatisticsLock,_std::default_delete<duckdb::TableStatisticsLock>,_true>::
  operator*(&lock);
  this_00 = TableStatistics::GetStats(&pRVar1->stats,(TableStatisticsLock *)lock_00,i);
  ColumnDefinition::GetType((LogicalType *)&__begin1,(ColumnDefinition *)default_executor);
  make_uniq<duckdb::SegmentStatistics,duckdb::LogicalType>
            ((duckdb *)&new_stats,(LogicalType *)&__begin1);
  LogicalType::~LogicalType((LogicalType *)&__begin1);
  local_e0.tree =
       &shared_ptr<duckdb::RowGroupSegmentTree,_true>::operator->
                  ((shared_ptr<duckdb::RowGroupSegmentTree,_true> *)
                   &(context->config).home_directory.field_2)->
        super_SegmentTree<duckdb::RowGroup,_true>;
  __begin1 = SegmentTree<duckdb::RowGroup,_true>::SegmentIterationHelper::begin(&local_e0);
  new_collection = __begin1.current;
  while (new_collection != (RowGroup *)0x0) {
    new_column_00 =
         (ColumnDefinition *)
         shared_ptr<duckdb::RowGroupCollection,_true>::operator*
                   ((shared_ptr<duckdb::RowGroupCollection,_true> *)this);
    RowGroup::AddColumn((RowGroup *)&new_row_group,(RowGroupCollection *)new_collection,
                        new_column_00,default_executor,in_R8);
    this_01 = unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>::operator->
                        (&new_row_group);
    other = ColumnStatistics::Statistics(this_00);
    RowGroup::MergeIntoStatistics(this_01,i,other);
    pRVar1 = shared_ptr<duckdb::RowGroupCollection,_true>::operator->
                       ((shared_ptr<duckdb::RowGroupCollection,_true> *)this);
    this_02 = shared_ptr<duckdb::RowGroupSegmentTree,_true>::operator->(&pRVar1->row_groups);
    local_128._M_t.super___uniq_ptr_impl<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>.
    _M_t.super__Tuple_impl<0UL,_duckdb::RowGroup_*,_std::default_delete<duckdb::RowGroup>_>.
    super__Head_base<0UL,_duckdb::RowGroup_*,_false>._M_head_impl =
         (__uniq_ptr_data<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true,_true>)
         (__uniq_ptr_data<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true,_true>)
         new_row_group.super_unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>.
         _M_t.super___uniq_ptr_impl<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::RowGroup_*,_std::default_delete<duckdb::RowGroup>_>.
         super__Head_base<0UL,_duckdb::RowGroup_*,_false>._M_head_impl;
    new_row_group.super_unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>._M_t.
    super___uniq_ptr_impl<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::RowGroup_*,_std::default_delete<duckdb::RowGroup>_>.
    super__Head_base<0UL,_duckdb::RowGroup_*,_false>._M_head_impl =
         (unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>)
         (__uniq_ptr_data<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true,_true>)0x0;
    SegmentTree<duckdb::RowGroup,_true>::AppendSegment
              (&this_02->super_SegmentTree<duckdb::RowGroup,_true>,
               (unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true> *)
               &local_128);
    ::std::unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>::~unique_ptr
              (&local_128);
    ::std::unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>::~unique_ptr
              ((unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_> *)
               &new_row_group);
    SegmentTree<duckdb::RowGroup,_true>::SegmentIterationHelper::SegmentIterator::Next(&__begin1);
    new_collection = __begin1.current;
  }
  ::std::unique_ptr<duckdb::SegmentStatistics,_std::default_delete<duckdb::SegmentStatistics>_>::
  ~unique_ptr(&new_stats.
               super_unique_ptr<duckdb::SegmentStatistics,_std::default_delete<duckdb::SegmentStatistics>_>
             );
  ::std::unique_ptr<duckdb::TableStatisticsLock,_std::default_delete<duckdb::TableStatisticsLock>_>
  ::~unique_ptr(&lock.
                 super_unique_ptr<duckdb::TableStatisticsLock,_std::default_delete<duckdb::TableStatisticsLock>_>
               );
  Vector::~Vector(&default_vector);
  DataChunk::~DataChunk(&dummy_chunk);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            (&new_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  sVar2.internal.super___shared_ptr<duckdb::RowGroupCollection,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  sVar2.internal.super___shared_ptr<duckdb::RowGroupCollection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       this;
  return (shared_ptr<duckdb::RowGroupCollection,_true>)
         sVar2.internal.super___shared_ptr<duckdb::RowGroupCollection,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<RowGroupCollection> RowGroupCollection::AddColumn(ClientContext &context, ColumnDefinition &new_column,
                                                             ExpressionExecutor &default_executor) {
	idx_t new_column_idx = types.size();
	auto new_types = types;
	new_types.push_back(new_column.GetType());
	auto result = make_shared_ptr<RowGroupCollection>(info, block_manager, std::move(new_types), row_start,
	                                                  total_rows.load(), row_group_size);

	DataChunk dummy_chunk;
	Vector default_vector(new_column.GetType());

	result->stats.InitializeAddColumn(stats, new_column.GetType());
	auto lock = result->stats.GetLock();
	auto &new_column_stats = result->stats.GetStats(*lock, new_column_idx);

	// fill the column with its DEFAULT value, or NULL if none is specified
	auto new_stats = make_uniq<SegmentStatistics>(new_column.GetType());
	for (auto &current_row_group : row_groups->Segments()) {
		auto new_row_group = current_row_group.AddColumn(*result, new_column, default_executor, default_vector);
		// merge in the statistics
		new_row_group->MergeIntoStatistics(new_column_idx, new_column_stats.Statistics());

		result->row_groups->AppendSegment(std::move(new_row_group));
	}

	return result;
}